

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

void __thiscall mognetwork::TcpSocket::TcpSocket(TcpSocket *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  Socket *in_stack_ffffffffffffffd0;
  Mutex *this_00;
  Socket *in_stack_fffffffffffffff0;
  
  Socket::Socket(in_stack_ffffffffffffffd0,(Type)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  *in_RDI = &PTR__TcpSocket_00126c70;
  this_00 = (Mutex *)(in_RDI + 2);
  std::__cxx11::
  list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ::list((list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
          *)0x11d6eb);
  ReadedDatas::ReadedDatas((ReadedDatas *)0x11d700);
  in_RDI[0xb] = 0;
  Mutex::Mutex(this_00);
  Socket::create(in_stack_fffffffffffffff0);
  return;
}

Assistant:

TcpSocket::TcpSocket() :
    Socket(Tcp), m_userData(NULL)
  {
    // Create the socket, and init it
    create();
  }